

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# battlewithlandlord.cc
# Opt level: O1

BattleWithLandlord * __thiscall
BattleWithLandlord::operator=(BattleWithLandlord *this,BattleWithLandlord *that)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  if (this != that) {
    std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
    operator=(&this->_cards[0]._M_t,&that->_cards[0]._M_t);
    std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
    operator=(&this->_cards[1]._M_t,&that->_cards[1]._M_t);
    iVar1 = (that->_last).id;
    iVar2 = (that->_last).len;
    iVar3 = (that->_last).carry;
    (this->_last).type = (that->_last).type;
    (this->_last).id = iVar1;
    (this->_last).len = iVar2;
    (this->_last).carry = iVar3;
    std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
    operator=(&(this->_last).pattern._M_t,&(that->_last).pattern._M_t);
    iVar1 = that->_round;
    this->_side = that->_side;
    this->_round = iVar1;
    this->_ready = true;
    this->_stopsearch = false;
  }
  return this;
}

Assistant:

BattleWithLandlord& BattleWithLandlord::operator=(const BattleWithLandlord &that) {
    if (this != &that) {
        _cards[0] = that._cards[0];
        _cards[1] = that._cards[1];
        _last = that._last;
        _round = that._round;
        _side = that._side;
        _ready = true;
        _stopsearch = false;
    }
    return *this;
}